

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  char *test_suite_name;
  int iVar1;
  ostream *poVar2;
  TestInfo *pTVar3;
  size_t width;
  size_t width_00;
  TimeInMillis ms;
  TimeInMillis ms_00;
  size_t width_01;
  int i;
  bool bVar4;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string kIndent;
  string kTestsuite;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestsuite,"testsuite",(allocator<char> *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0x6,width);
  Indent_abi_cxx11_(&local_b8,(internal *)0x4,width_00);
  poVar2 = std::operator<<(stream,(string *)&local_b8);
  std::operator<<(poVar2,"{\n");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"name",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,(test_suite->name_)._M_dataplus._M_p,&local_91);
  OutputJsonKey(stream,&kTestsuite,&local_b8,&local_90,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"tests",(allocator<char> *)&local_90);
  iVar1 = TestSuite::reportable_test_count(test_suite);
  OutputJsonKey(stream,&kTestsuite,&local_b8,iVar1,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"failures",(allocator<char> *)&local_90);
    iVar1 = TestSuite::failed_test_count(test_suite);
    OutputJsonKey(stream,&kTestsuite,&local_b8,iVar1,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"disabled",(allocator<char> *)&local_90);
    iVar1 = TestSuite::reportable_disabled_test_count(test_suite);
    OutputJsonKey(stream,&kTestsuite,&local_b8,iVar1,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"errors",(allocator<char> *)&local_90);
    OutputJsonKey(stream,&kTestsuite,&local_b8,0,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"timestamp",&local_b9);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_90,(internal *)test_suite->start_timestamp_,ms);
    OutputJsonKey(stream,&kTestsuite,&local_b8,&local_90,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"time",&local_b9);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_90,(internal *)test_suite->elapsed_time_,ms_00);
    OutputJsonKey(stream,&kTestsuite,&local_b8,&local_90,&kIndent,false);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    TestPropertiesAsJson(&local_b8,&test_suite->ad_hoc_test_result_,&kIndent);
    poVar2 = std::operator<<(stream,(string *)&local_b8);
    std::operator<<(poVar2,",\n");
    std::__cxx11::string::~string((string *)&local_b8);
  }
  poVar2 = std::operator<<(stream,(string *)&kIndent);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,(string *)&kTestsuite);
  std::operator<<(poVar2,"\": [\n");
  bVar4 = false;
  for (iVar1 = 0;
      iVar1 < (int)((ulong)((long)(test_suite->test_info_list_).
                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(test_suite->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar1 = iVar1 + 1
      ) {
    pTVar3 = TestSuite::GetTestInfo(test_suite,iVar1);
    if ((pTVar3->matches_filter_ == true) && ((pTVar3->is_in_another_shard_ & 1U) == 0)) {
      if (bVar4) {
        std::operator<<(stream,",\n");
      }
      test_suite_name = (test_suite->name_)._M_dataplus._M_p;
      pTVar3 = TestSuite::GetTestInfo(test_suite,iVar1);
      bVar4 = true;
      OutputJsonTestInfo(stream,test_suite_name,pTVar3);
    }
  }
  poVar2 = std::operator<<(stream,"\n");
  poVar2 = std::operator<<(poVar2,(string *)&kIndent);
  poVar2 = std::operator<<(poVar2,"]\n");
  Indent_abi_cxx11_(&local_b8,(internal *)0x4,width_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_b8);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuite);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsRFC3339(test_suite.start_timestamp()),
        kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }
  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}